

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integer_cast_operator.hpp
# Opt level: O0

bool duckdb::
     IntegerCastLoop<duckdb::HugeIntCastData<duckdb::uhugeint_t,_duckdb::Uhugeint,_unsigned_long>,_true,_true,_duckdb::HugeIntegerCastOperation,____>
               (char *buf,idx_t len,
               HugeIntCastData<duckdb::uhugeint_t,_duckdb::Uhugeint,_unsigned_long> *result,
               bool strict)

{
  byte bVar1;
  bool bVar2;
  uchar uVar3;
  byte in_CL;
  HugeIntCastData<duckdb::uhugeint_t,_duckdb::Uhugeint,_unsigned_long> *in_RSI;
  long in_RDI;
  uchar digit;
  int negative;
  ExponentData exponent;
  idx_t start_digit;
  bool number_before_period;
  idx_t pos;
  idx_t start_pos;
  int32_t in_stack_000000e4;
  HugeIntCastData<duckdb::uhugeint_t,_duckdb::Uhugeint,_unsigned_long> *in_stack_000000e8;
  undefined8 in_stack_ffffffffffffffa0;
  undefined7 in_stack_ffffffffffffffa8;
  undefined1 auStack_4a [2];
  HugeIntCastData<duckdb::uhugeint_t,_duckdb::Uhugeint,_unsigned_long> *pHStack_48;
  byte in_stack_ffffffffffffffc7;
  HugeIntCastData<duckdb::uhugeint_t,_duckdb::Uhugeint,_unsigned_long> *pHVar4;
  HugeIntCastData<duckdb::uhugeint_t,_duckdb::Uhugeint,_unsigned_long> *pHVar5;
  HugeIntCastData<duckdb::uhugeint_t,_duckdb::Uhugeint,_unsigned_long> *len_00;
  undefined7 in_stack_ffffffffffffffd8;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  
  bVar1 = in_CL & 1;
  len_00 = (HugeIntCastData<duckdb::uhugeint_t,_duckdb::Uhugeint,_unsigned_long> *)0x1;
  pHVar4 = (HugeIntCastData<duckdb::uhugeint_t,_duckdb::Uhugeint,_unsigned_long> *)0x1;
  while( true ) {
    if (in_RSI <= pHVar4) goto LAB_02b0273e;
    bVar2 = StringUtil::CharacterIsDigit(*(char *)((long)&(pHVar4->result).lower + in_RDI));
    if (!bVar2) break;
    pHVar5 = (HugeIntCastData<duckdb::uhugeint_t,_duckdb::Uhugeint,_unsigned_long> *)
             ((long)&(pHVar4->result).lower + 1);
    uVar3 = UnsafeNumericCast<unsigned_char,_int,_void>
                      (*(char *)((long)&(pHVar4->result).lower + in_RDI) + -0x30);
    bVar2 = HugeIntegerCastOperation::
            HandleDigit<duckdb::HugeIntCastData<duckdb::uhugeint_t,_duckdb::Uhugeint,_unsigned_long>,_true>
                      ((HugeIntCastData<duckdb::uhugeint_t,_duckdb::Uhugeint,_unsigned_long> *)
                       CONCAT17(uVar3,in_stack_ffffffffffffffa8),
                       (uint8_t)((ulong)in_stack_ffffffffffffffa0 >> 0x38));
    if (!bVar2) {
      return false;
    }
    pHVar4 = pHVar5;
    if ((((pHVar5 != in_RSI) && (*(char *)((long)&(pHVar5->result).lower + in_RDI) == '_')) &&
        ((bVar1 & 1) == 0)) &&
       ((pHVar4 = (HugeIntCastData<duckdb::uhugeint_t,_duckdb::Uhugeint,_unsigned_long> *)
                  ((long)&(pHVar5->result).lower + 1), pHVar4 == in_RSI ||
        (bVar2 = StringUtil::CharacterIsDigit(*(char *)((long)&(pHVar4->result).lower + in_RDI)),
        !bVar2)))) {
      return false;
    }
  }
  if (*(char *)((long)&(pHVar4->result).lower + in_RDI) != '.') goto LAB_02b02502;
  if ((bVar1 & 1) != 0) {
    return false;
  }
  in_stack_ffffffffffffffc7 = len_00 < pHVar4;
  pHStack_48 = (HugeIntCastData<duckdb::uhugeint_t,_duckdb::Uhugeint,_unsigned_long> *)
               ((long)&(pHVar4->result).lower + 1);
  pHVar5 = pHStack_48;
  while ((pHVar4 = pHVar5, pHVar4 < in_RSI &&
         (bVar2 = StringUtil::CharacterIsDigit(*(char *)((long)&(pHVar4->result).lower + in_RDI)),
         bVar2))) {
    UnsafeNumericCast<unsigned_char,_int,_void>
              (*(char *)((long)&(pHVar4->result).lower + in_RDI) + -0x30);
    bVar2 = HugeIntegerCastOperation::
            HandleDecimal<duckdb::HugeIntCastData<duckdb::uhugeint_t,_duckdb::Uhugeint,_unsigned_long>,_true,_true>
                      ((HugeIntCastData<duckdb::uhugeint_t,_duckdb::Uhugeint,_unsigned_long> *)
                       CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),
                       (uint8_t)((ulong)in_RDI >> 0x38));
    if (!bVar2) {
      return false;
    }
    pHVar5 = (HugeIntCastData<duckdb::uhugeint_t,_duckdb::Uhugeint,_unsigned_long> *)
             ((long)&(pHVar4->result).lower + 1);
    if (((pHVar5 != in_RSI) && (*(char *)((long)&(pHVar5->result).lower + in_RDI) == '_')) &&
       ((pHVar5 = (HugeIntCastData<duckdb::uhugeint_t,_duckdb::Uhugeint,_unsigned_long> *)
                  ((long)&(pHVar4->result).lower + 2), pHVar5 == in_RSI ||
        (bVar2 = StringUtil::CharacterIsDigit(*(char *)((long)&(pHVar5->result).lower + in_RDI)),
        !bVar2)))) {
      return false;
    }
  }
  if (((in_stack_ffffffffffffffc7 & 1) == 0) && (pHVar4 <= pHStack_48)) {
    return false;
  }
  if (pHVar4 < in_RSI) {
LAB_02b02502:
    bVar2 = StringUtil::CharacterIsSpace(*(char *)((long)&(pHVar4->result).lower + in_RDI));
    if (bVar2) {
      do {
        pHVar4 = (HugeIntCastData<duckdb::uhugeint_t,_duckdb::Uhugeint,_unsigned_long> *)
                 ((long)&(pHVar4->result).lower + 1);
        if (in_RSI <= pHVar4) goto LAB_02b0273e;
        bVar2 = StringUtil::CharacterIsSpace(*(char *)((long)&(pHVar4->result).lower + in_RDI));
      } while (bVar2);
      bVar2 = false;
    }
    else if ((*(char *)((long)&(pHVar4->result).lower + in_RDI) == 'e') ||
            (*(char *)((long)&(pHVar4->result).lower + in_RDI) == 'E')) {
      if ((bVar1 & 1) == 0) {
        if (pHVar4 == len_00) {
          bVar2 = false;
        }
        else {
          pHVar4 = (HugeIntCastData<duckdb::uhugeint_t,_duckdb::Uhugeint,_unsigned_long> *)
                   ((long)&(pHVar4->result).lower + 1);
          if (pHVar4 < in_RSI) {
            memset(auStack_4a,0,2);
            if (*(char *)((long)&(pHVar4->result).lower + in_RDI) == '-') {
              bVar2 = IntegerCastLoop<duckdb::IntegerCastData<short>,_true,_false,_duckdb::IntegerCastOperation,____>
                                ((char *)CONCAT17(bVar1,in_stack_ffffffffffffffd8),(idx_t)len_00,
                                 (IntegerCastData<short> *)pHVar4,(bool)in_stack_ffffffffffffffc7);
              if (!bVar2) {
                return false;
              }
            }
            else {
              bVar2 = IntegerCastLoop<duckdb::IntegerCastData<short>,_false,_false,_duckdb::IntegerCastOperation,____>
                                ((char *)CONCAT17(bVar1,in_stack_ffffffffffffffd8),(idx_t)len_00,
                                 (IntegerCastData<short> *)pHVar4,(bool)in_stack_ffffffffffffffc7);
              if (!bVar2) {
                return false;
              }
            }
            bVar2 = HugeIntegerCastOperation::
                    HandleExponent<duckdb::HugeIntCastData<duckdb::uhugeint_t,_duckdb::Uhugeint,_unsigned_long>,_true>
                              (in_stack_000000e8,in_stack_000000e4);
          }
          else {
            bVar2 = false;
          }
        }
      }
      else {
        bVar2 = false;
      }
    }
    else {
      bVar2 = false;
    }
    return bVar2;
  }
LAB_02b0273e:
  bVar2 = HugeIntegerCastOperation::
          Finalize<duckdb::HugeIntCastData<duckdb::uhugeint_t,_duckdb::Uhugeint,_unsigned_long>,_true>
                    (in_RSI);
  if (!bVar2) {
    return false;
  }
  return len_00 < pHVar4;
}

Assistant:

static bool IntegerCastLoop(const char *buf, idx_t len, T &result, bool strict) {
	idx_t start_pos;
	if (NEGATIVE) {
		start_pos = 1;
	} else {
		if (*buf == '+') {
			if (strict) {
				// leading plus is not allowed in strict mode
				return false;
			}
			start_pos = 1;
		} else {
			start_pos = 0;
		}
	}
	idx_t pos = start_pos;
	while (pos < len) {
		if (!StringUtil::CharacterIsDigit(buf[pos])) {
			// not a digit!
			if (buf[pos] == decimal_separator) {
				if (strict) {
					return false;
				}
				bool number_before_period = pos > start_pos;
				// decimal point: we accept decimal values for integers as well
				// we just truncate them
				// make sure everything after the period is a number
				pos++;
				idx_t start_digit = pos;
				while (pos < len) {
					if (!StringUtil::CharacterIsDigit(buf[pos])) {
						break;
					}
					if (!OP::template HandleDecimal<T, NEGATIVE, ALLOW_EXPONENT>(
					        result, UnsafeNumericCast<uint8_t>(buf[pos] - '0'))) {
						return false;
					}
					pos++;

					if (pos != len && buf[pos] == '_') {
						// Skip one underscore if it is not the last character and followed by a digit
						pos++;
						if (pos == len || !StringUtil::CharacterIsDigit(buf[pos])) {
							return false;
						}
					}
				}
				// make sure there is either (1) one number after the period, or (2) one number before the period
				// i.e. we accept "1." and ".1" as valid numbers, but not "."
				if (!(number_before_period || pos > start_digit)) {
					return false;
				}
				if (pos >= len) {
					break;
				}
			}
			if (StringUtil::CharacterIsSpace(buf[pos])) {
				// skip any trailing spaces
				while (++pos < len) {
					if (!StringUtil::CharacterIsSpace(buf[pos])) {
						return false;
					}
				}
				break;
			}
			if (ALLOW_EXPONENT) {
				if (buf[pos] == 'e' || buf[pos] == 'E') {
					if (strict) {
						return false;
					}
					if (pos == start_pos) {
						return false;
					}
					pos++;
					if (pos >= len) {
						return false;
					}
					using ExponentData = IntegerCastData<int16_t>;
					ExponentData exponent {};
					int negative = buf[pos] == '-';
					if (negative) {
						if (!IntegerCastLoop<ExponentData, true, false, IntegerCastOperation, decimal_separator>(
						        buf + pos, len - pos, exponent, strict)) {
							return false;
						}
					} else {
						if (!IntegerCastLoop<ExponentData, false, false, IntegerCastOperation, decimal_separator>(
						        buf + pos, len - pos, exponent, strict)) {
							return false;
						}
					}
					return OP::template HandleExponent<T, NEGATIVE>(result, exponent.result);
				}
			}
			return false;
		}
		auto digit = UnsafeNumericCast<uint8_t>(buf[pos++] - '0');
		if (!OP::template HandleDigit<T, NEGATIVE>(result, digit)) {
			return false;
		}

		if (pos != len && buf[pos] == '_' && !strict) {
			// Skip one underscore if it is not the last character and followed by a digit
			pos++;
			if (pos == len || !StringUtil::CharacterIsDigit(buf[pos])) {
				return false;
			}
		}
	}
	if (!OP::template Finalize<T, NEGATIVE>(result)) {
		return false;
	}
	return pos > start_pos;
}